

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

void save_load(bfgs *b,io_buf *model_file,bool read,bool text)

{
  bool bVar1;
  uint32_t uVar2;
  undefined8 uVar3;
  float *pfVar4;
  double *pdVar5;
  ostream *poVar6;
  void *this;
  size_t sVar7;
  long lVar8;
  io_buf *io;
  byte in_CL;
  byte in_DL;
  long in_RSI;
  long *in_RDI;
  stringstream msg;
  bool reg_vector;
  char *header_fmt;
  uint32_t stride_shift;
  int m;
  stringstream __msg;
  uint32_t length;
  vw *all;
  char *in_stack_fffffffffffffbf8;
  undefined4 uVar9;
  io_buf *model_file_00;
  char *in_stack_fffffffffffffc00;
  undefined8 in_stack_fffffffffffffc08;
  undefined1 text_00;
  char *in_stack_fffffffffffffc10;
  string *in_stack_fffffffffffffc18;
  undefined1 read_00;
  char *in_stack_fffffffffffffc20;
  int iVar10;
  char *in_stack_fffffffffffffc28;
  vw_exception *in_stack_fffffffffffffc30;
  byte local_3bb;
  byte local_3ba;
  bool local_3b9;
  int local_3ac;
  stringstream local_3a0 [16];
  ostream local_390;
  undefined6 in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdce;
  undefined1 in_stack_fffffffffffffdcf;
  io_buf *in_stack_fffffffffffffdd0;
  bfgs *in_stack_fffffffffffffdd8;
  vw *in_stack_fffffffffffffde0;
  stringstream local_1c8 [16];
  ostream local_1b8;
  int local_3c;
  vw *local_38;
  byte local_2a;
  byte local_29;
  long local_28;
  long *local_20;
  
  text_00 = (undefined1)((ulong)in_stack_fffffffffffffc08 >> 0x38);
  local_29 = in_DL & 1;
  local_2a = in_CL & 1;
  local_38 = (vw *)*in_RDI;
  local_3c = 1 << ((byte)local_38->num_bits & 0x1f);
  local_28 = in_RSI;
  local_20 = in_RDI;
  if (local_29 != 0) {
    initialize_regressor((vw *)0x2784aa);
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
    if (bVar1) {
      pfVar4 = calloc_or_throw<float>
                         (CONCAT17(in_stack_fffffffffffffdcf,
                                   CONCAT16(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8)));
      local_20[0x1b] = (long)pfVar4;
      if (local_20[0x1b] == 0) {
        std::__cxx11::stringstream::stringstream(local_1c8);
        iVar10 = (int)((ulong)in_stack_fffffffffffffc20 >> 0x20);
        std::operator<<(&local_1b8,"Failed to allocate regularizers array: try decreasing -b <bits>"
                       );
        uVar3 = __cxa_allocate_exception(0x38);
        std::__cxx11::stringstream::str();
        VW::vw_exception::vw_exception
                  (in_stack_fffffffffffffc30,in_stack_fffffffffffffc28,iVar10,
                   in_stack_fffffffffffffc18);
        __cxa_throw(uVar3,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
      }
    }
    iVar10 = (int)local_20[1];
    if (iVar10 == 0) {
      local_3ac = 1;
    }
    else {
      local_3ac = iVar10 << 1;
    }
    *(int *)((long)local_20 + 0xb4) = local_3ac;
    vw::length(local_38);
    pfVar4 = calloc_or_throw<float>
                       (CONCAT17(in_stack_fffffffffffffdcf,
                                 CONCAT16(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8)));
    local_20[0x18] = (long)pfVar4;
    pdVar5 = calloc_or_throw<double>
                       (CONCAT17(in_stack_fffffffffffffdcf,
                                 CONCAT16(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8)));
    local_20[0x19] = (long)pdVar5;
    pdVar5 = calloc_or_throw<double>
                       (CONCAT17(in_stack_fffffffffffffdcf,
                                 CONCAT16(in_stack_fffffffffffffdce,in_stack_fffffffffffffdc8)));
    local_20[0x1a] = (long)pdVar5;
    uVar2 = parameters::stride_shift((parameters *)in_stack_fffffffffffffbf8);
    if ((local_38->quiet & 1U) == 0) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"m = ");
      this = (void *)std::ostream::operator<<(poVar6,iVar10);
      poVar6 = (ostream *)std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<(poVar6,"Allocated ");
      sVar7 = vw::length(local_38);
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (poVar6,sVar7 * ((long)*(int *)((long)local_20 + 0xb4) * 4 +
                                         (4L << ((byte)uVar2 & 0x3f))) >> 0x14);
      poVar6 = std::operator<<(poVar6,"M for weights and mem");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    local_20[0xd] = 0;
    ftime(local_20 + 9);
    if ((local_38->quiet & 1U) == 0) {
      in_stack_fffffffffffffbf8 = "wolfe1";
      in_stack_fffffffffffffc00 = "wolfe2";
      text_00 = 0;
      in_stack_fffffffffffffc10 = "curvature";
      in_stack_fffffffffffffc18 = (string *)0x0;
      in_stack_fffffffffffffc20 = "step size";
      fprintf(_stderr,"%2s %-10s\t%-10s\t%-10s\t %-10s\t%-10s\t%-10s\t%-10s\t%-10s\t%-s\n","##",
              "avg. loss","der. mag.","d. m. cond.");
      std::ios_base::precision((ios_base *)((long)&std::cerr + *(long *)(std::cerr + -0x18)),5);
    }
    if (local_20[0x1b] != 0) {
      local_38->l2_lambda = 1.0;
    }
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
    local_3b9 = true;
    if (!bVar1) {
      local_3b9 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8);
    }
    *(bool *)(local_20 + 0x17) = local_3b9;
    reset_state((vw *)in_stack_fffffffffffffc00,(bfgs *)in_stack_fffffffffffffbf8,false);
  }
  read_00 = (undefined1)((ulong)in_stack_fffffffffffffc18 >> 0x38);
  uVar9 = (undefined4)((ulong)in_stack_fffffffffffffbf8 >> 0x20);
  if (((*(byte *)(local_20 + 0x17) & 1) == 0) || (local_3ba = 1, (local_29 & 1) != 0)) {
    lVar8 = std::__cxx11::string::length();
    local_3bb = 0;
    if (lVar8 != 0) {
      local_3bb = local_29;
    }
    local_3ba = local_3bb;
  }
  sVar7 = v_array<int>::size((v_array<int> *)(local_28 + 0x30));
  if (sVar7 != 0) {
    std::__cxx11::stringstream::stringstream(local_3a0);
    io = (io_buf *)std::operator<<(&local_390,":");
    poVar6 = (ostream *)std::ostream::operator<<(io,(bool)(local_3ba & 1));
    std::operator<<(poVar6,"\n");
    model_file_00 = (io_buf *)(CONCAT44(uVar9,(uint)local_2a) & 0xffffffff00000001);
    bin_text_read_write_fixed
              (io,(char *)poVar6,(size_t)in_stack_fffffffffffffc28,in_stack_fffffffffffffc20,
               (bool)read_00,(stringstream *)in_stack_fffffffffffffc10,(bool)text_00);
    if ((bool)(local_3ba & 1) == false) {
      GD::save_load_regressor((vw *)in_stack_fffffffffffffc00,model_file_00,false,false);
    }
    else {
      save_load_regularizer
                (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
                 (bool)in_stack_fffffffffffffdcf,(bool)in_stack_fffffffffffffdce);
    }
    std::__cxx11::stringstream::~stringstream(local_3a0);
  }
  return;
}

Assistant:

void save_load(bfgs& b, io_buf& model_file, bool read, bool text)
{
  vw* all = b.all;

  uint32_t length = 1 << all->num_bits;

  if (read)
  {
    initialize_regressor(*all);
    if (all->per_feature_regularizer_input != "")
    {
      b.regularizers = calloc_or_throw<weight>(2 * length);
      if (b.regularizers == nullptr)
        THROW("Failed to allocate regularizers array: try decreasing -b <bits>");
    }
    int m = b.m;

    b.mem_stride = (m == 0) ? CG_EXTRA : 2 * m;
    b.mem = calloc_or_throw<float>(all->length() * b.mem_stride);
    b.rho = calloc_or_throw<double>(m);
    b.alpha = calloc_or_throw<double>(m);

    uint32_t stride_shift = all->weights.stride_shift();

    if (!all->quiet)
      cerr << "m = " << m << endl
           << "Allocated "
           << ((long unsigned int)all->length() * (sizeof(float) * (b.mem_stride) + (sizeof(weight) << stride_shift)) >>
                  20)
           << "M for weights and mem" << endl;

    b.net_time = 0.0;
    ftime(&b.t_start_global);

    if (!all->quiet)
    {
      const char* header_fmt = "%2s %-10s\t%-10s\t%-10s\t %-10s\t%-10s\t%-10s\t%-10s\t%-10s\t%-s\n";
      fprintf(stderr, header_fmt, "##", "avg. loss", "der. mag.", "d. m. cond.", "wolfe1", "wolfe2", "mix fraction",
          "curvature", "dir. magnitude", "step size");
      cerr.precision(5);
    }

    if (b.regularizers != nullptr)
      all->l2_lambda = 1;  // To make sure we are adding the regularization
    b.output_regularizer = (all->per_feature_regularizer_output != "" || all->per_feature_regularizer_text != "");
    reset_state(*all, b, false);
  }

  // bool reg_vector = b.output_regularizer || all->per_feature_regularizer_input.length() > 0;
  bool reg_vector = (b.output_regularizer && !read) || (all->per_feature_regularizer_input.length() > 0 && read);

  if (model_file.files.size() > 0)
  {
    stringstream msg;
    msg << ":" << reg_vector << "\n";
    bin_text_read_write_fixed(model_file, (char*)&reg_vector, sizeof(reg_vector), "", read, msg, text);

    if (reg_vector)
      save_load_regularizer(*all, b, model_file, read, text);
    else
      GD::save_load_regressor(*all, model_file, read, text);
  }
}